

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object_State_Header.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Object_State_Header::Object_State_Header
          (Object_State_Header *this,EntityIdentifier *ObjID,EntityIdentifier *RefObjID,
          KUINT16 UpdateNum,ForceID FI)

{
  KUINT16 KVar1;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Object_State_Header_00215c28;
  (this->m_ObjID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_002167c8;
  KVar1 = (ObjID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_ObjID).super_SimulationIdentifier.m_ui16SiteID =
       (ObjID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_ObjID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_ObjID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00216468;
  *(undefined2 *)&(this->m_ObjID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(ObjID->super_SimulationIdentifier).field_0xc;
  (this->m_RefObjID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_002167c8;
  KVar1 = (RefObjID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_RefObjID).super_SimulationIdentifier.m_ui16SiteID =
       (RefObjID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_RefObjID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_RefObjID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00216468;
  *(undefined2 *)&(this->m_RefObjID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(RefObjID->super_SimulationIdentifier).field_0xc;
  this->m_ui16UpdateNum = UpdateNum;
  this->m_ui8ForceID = (KUINT8)FI;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\t';
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Object_State_Header::Object_State_Header( const EntityIdentifier & ObjID, const EntityIdentifier & RefObjID ,
        KUINT16 UpdateNum, ForceID FI ) :
    m_ObjID( ObjID ),
    m_RefObjID( RefObjID ),
    m_ui16UpdateNum( UpdateNum ),
    m_ui8ForceID( FI )
{
    m_ui8ProtocolFamily = SyntheticEnvironment;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
}